

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dimensions.hpp
# Opt level: O0

size_t std::experimental::detail::
       index_into_dynamic_dims<int,unsigned_long,unsigned_long,unsigned_long>
                 (int idx,unsigned_long head,unsigned_long tail,unsigned_long tail_1)

{
  undefined4 local_3c;
  undefined8 local_38;
  undefined4 local_2c;
  unsigned_long tail_local_1;
  unsigned_long tail_local;
  unsigned_long head_local;
  int idx_local;
  
  if ((head == 0xffffffffffffffff) && (idx != 0)) {
    if (idx == 0) {
      local_2c = 0;
    }
    else {
      local_2c = idx + -1;
    }
    local_38 = index_into_dynamic_dims<int,unsigned_long,unsigned_long>(local_2c,tail,tail_1);
    local_38 = local_38 + 1;
  }
  else {
    if (idx == 0) {
      local_3c = 0;
    }
    else {
      local_3c = idx + -1;
    }
    local_38 = index_into_dynamic_dims<int,unsigned_long,unsigned_long>(local_3c,tail,tail_1);
  }
  return local_38;
}

Assistant:

inline constexpr std::size_t index_into_dynamic_dims(
    Idx idx, Head head, Tail... tail
    ) noexcept
{
    return
        // FIXME: Is idx != 0 needed
        ( head == dyn && idx != 0
        ? index_into_dynamic_dims((idx != 0 ? idx - 1 : idx), tail...) + 1
        : index_into_dynamic_dims((idx != 0 ? idx - 1 : idx), tail...)
        );
}